

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_hashtbl_test.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  char cVar2;
  size_t sVar3;
  int iVar4;
  uo_strhashtbl *hashtbl;
  char *pcVar5;
  char *pcVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  byte bVar10;
  uo_strhashtbl *puVar11;
  size_t i_2;
  size_t sVar12;
  size_t i;
  size_t sVar13;
  long lVar14;
  bool bVar15;
  
  sVar13 = 0;
  hashtbl = uo_strhashtbl_create(0);
  uo_strhashtbl_set(hashtbl,"key1","value1");
  sVar12 = hashtbl->count;
  pcVar5 = (char *)uo_strhashtbl_get(hashtbl,"key1");
  pcVar6 = (char *)uo_strhashtbl_remove(hashtbl,"key1");
  sVar3 = hashtbl->count;
  pvVar7 = uo_strhashtbl_get(hashtbl,"key1");
  bVar15 = pvVar7 == (void *)0x0 &&
           (((pcVar6 == "value1" && pcVar5 == "value1") && sVar12 == 1) && sVar3 == 0);
  while( true ) {
    pcVar5 = lorem;
    if (sVar13 == 0x1000) break;
    bVar15 = (bool)(bVar15 & sVar13 == hashtbl->count);
    uo_strhashtbl_set(hashtbl,lorem + sVar13,lorem + sVar13);
    sVar13 = sVar13 + 1;
  }
  bVar10 = bVar15 & hashtbl->count == 0x1000;
  puVar11 = hashtbl;
  for (lVar14 = 0; lVar14 != 0x1000; lVar14 = lVar14 + 1) {
    puVar11 = (uo_strhashtbl *)(puVar11->head).next;
    iVar4 = strcmp((char *)puVar11->removed_count,pcVar5 + lVar14);
    bVar10 = bVar10 & iVar4 == 0;
  }
  for (lVar14 = 0; lVar14 != 0x1000; lVar14 = lVar14 + 1) {
    pcVar5 = (char *)uo_strhashtbl_remove(hashtbl,lorem + lVar14);
    pcVar6 = lorem + lVar14;
    bVar10 = bVar10 & pcVar6 == pcVar5;
    uo_strhashtbl_set(hashtbl,pcVar6,pcVar6);
  }
  sVar12 = 0x1000;
  for (lVar14 = 0; pcVar5 = lorem, sVar3 = hashtbl->count, lVar14 != 0xf00; lVar14 = lVar14 + 1) {
    pcVar5 = (char *)uo_strhashtbl_remove(hashtbl,lorem + lVar14);
    bVar10 = bVar10 & (lorem + lVar14 == pcVar5 && sVar3 == sVar12);
    sVar12 = sVar12 - 1;
  }
  lVar14 = 0x100;
  puVar11 = hashtbl;
  while (bVar15 = lVar14 != 0, lVar14 = lVar14 + -1, bVar15) {
    puVar11 = (uo_strhashtbl *)(puVar11->head).prev;
  }
  bVar10 = bVar10 & sVar3 == 0x100;
  for (lVar14 = 0; lVar14 != 0xff; lVar14 = lVar14 + 1) {
    iVar4 = strcmp((char *)puVar11->removed_count,pcVar5 + lVar14 + 0xf00);
    bVar10 = bVar10 & iVar4 == 0;
    puVar11 = (uo_strhashtbl *)(puVar11->head).next;
  }
  pvVar7 = uo_strhashtbl_get(hashtbl,"");
  pvVar8 = uo_strhashtbl_remove(hashtbl,"");
  uo_strhashtbl_set(hashtbl,"","");
  pcVar5 = (char *)uo_strhashtbl_get(hashtbl,"");
  cVar1 = *pcVar5;
  pcVar5 = (char *)uo_strhashtbl_remove(hashtbl,"");
  cVar2 = *pcVar5;
  pvVar9 = uo_strhashtbl_get(hashtbl,"");
  free(hashtbl->links);
  free(hashtbl);
  return (int)(byte)(bVar10 & (pvVar9 == (void *)0x0 &&
                              (pvVar8 == (void *)0x0 && pvVar7 == (void *)0x0)) &
                     (cVar1 == '\0' && cVar2 == '\0') ^ 1);
}

Assistant:

int main(
    int argc, 
    char const **argv)
{
    bool passed = true;

    uo_strhashtbl *hashtbl = uo_strhashtbl_create(0);
    const char *key1 = "key1";
    const char *value1 = "value1";
    uo_strhashtbl_set(hashtbl, key1, value1);
    passed &= hashtbl->count == 1;
    passed &= uo_strhashtbl_get(hashtbl, key1) == value1;
    passed &= uo_strhashtbl_remove(hashtbl, key1) == value1;
    passed &= hashtbl->count == 0;
    passed &= uo_strhashtbl_get(hashtbl, key1) == NULL;

    for (size_t i = 0; i < 0x1000; ++i)
    {
        passed &= hashtbl->count == i;
        uo_strhashtbl_set(hashtbl, lorem + i, lorem + i);
    }

    passed &= hashtbl->count == 0x1000;

    uo_strkvp_linklist *link = uo_strhashtbl_list(hashtbl);
    for (size_t i = 0; i < 0x1000; ++i)
    {
        link = uo_strkvp_linklist_next(link);
        passed &= strcmp(link->item.value, lorem + i) == 0;
    }

    for (size_t i = 0; i < 0x1000; ++i)
    {
        passed &= uo_strhashtbl_remove(hashtbl, lorem + i) == lorem + i;
        uo_strhashtbl_set(hashtbl, lorem + i, lorem + i);
    }

    for (size_t i = 0; i < (0x1000 - 0x100); ++i)
    {
        passed &= hashtbl->count == 0x1000 - i;
        passed &= uo_strhashtbl_remove(hashtbl, lorem + i) == lorem + i;
    }

    passed &= hashtbl->count == 0x100;

    link = uo_strhashtbl_list(hashtbl);

    for (size_t i = 0; i < 0x100; ++i)
        link = uo_strkvp_linklist_prev(link);

    for (size_t i = (0x1000 - 0x100); i < 0x1000 - 1; ++i)
    {
        passed &= strcmp(link->item.value, lorem + i) == 0;
        link = uo_strkvp_linklist_next(link);
    }

    passed &= uo_strhashtbl_get(hashtbl, "") == NULL;
    passed &= uo_strhashtbl_remove(hashtbl, "") == NULL;
    uo_strhashtbl_set(hashtbl, "", "");
    passed &= strcmp(uo_strhashtbl_get(hashtbl, ""), "") == 0;
    passed &= strcmp(uo_strhashtbl_remove(hashtbl, ""), "") == 0;
    passed &= uo_strhashtbl_get(hashtbl, "") == NULL;

    uo_strhashtbl_destroy(hashtbl);

    return passed ? 0 : 1;
}